

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O2

void __thiscall
Eigen::
CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>
::CwiseBinaryOp(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>
                *this,Lhs *aLhs,Rhs *aRhs,scalar_quotient_op<double,_double> *func)

{
  long lVar1;
  
  (this->m_lhs).m_expression = aLhs->m_expression;
  lVar1 = (aRhs->m_rowFactor).m_value;
  (this->m_rhs).m_matrix.m_expression.m_matrix = (aRhs->m_matrix).m_expression.m_matrix;
  (this->m_rhs).m_rowFactor.m_value = lVar1;
  if (((aLhs->m_expression->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_rows == (aRhs->m_rowFactor).m_value) &&
     ((aLhs->m_expression->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_cols ==
      (((aRhs->m_matrix).m_expression.m_matrix)->
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)) {
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x6e,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, const Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, LhsType = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, RhsType = const Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>, -1, 1>]"
               );
}

Assistant:

CwiseBinaryOp(const Lhs& aLhs, const Rhs& aRhs, const BinaryOp& func = BinaryOp())
      : m_lhs(aLhs), m_rhs(aRhs), m_functor(func)
    {
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename Rhs::Scalar);
      // require the sizes to match
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs, Rhs)
      eigen_assert(aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols());
    }